

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

SoapySDRRange * SoapySDRDevice_getGainRange(SoapySDRDevice *device,int direction,size_t channel)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  long *in_RSI;
  Range *in_RDI;
  exception *ex;
  undefined1 local_30 [24];
  undefined8 local_18;
  undefined4 local_c;
  long *local_8;
  
  local_18 = in_RCX;
  local_c = in_EDX;
  local_8 = in_RSI;
  SoapySDRDevice_clearError();
  (**(code **)(*local_8 + 0x1a8))(local_30,local_8,local_c,local_18);
  toRange(in_RDI);
  return (SoapySDRRange *)in_RDI;
}

Assistant:

SoapySDRRange SoapySDRDevice_getGainRange(const SoapySDRDevice *device, const int direction, const size_t channel)
{
    __SOAPY_SDR_C_TRY
    return toRange(device->getGainRange(direction, channel));
    __SOAPY_SDR_C_CATCH_RET(SoapySDRRangeNAN);
}